

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_hdwallet.cpp
# Opt level: O3

uint32_t cfd::api::HDWalletApi::GetExtkeyVersion(ExtKeyType key_type,NetType net_type)

{
  uint32_t uVar1;
  uint32_t uVar2;
  
  uVar2 = 0x4358394;
  if (net_type == kLiquidV1 || net_type == kMainnet) {
    uVar2 = 0x488ade4;
  }
  uVar1 = 0x43587cf;
  if (net_type == kLiquidV1 || net_type == kMainnet) {
    uVar1 = 0x488b21e;
  }
  if (key_type == kExtPrivkey) {
    uVar1 = uVar2;
  }
  return uVar1;
}

Assistant:

uint32_t HDWalletApi::GetExtkeyVersion(ExtKeyType key_type, NetType net_type) {
  uint32_t version;
  if (key_type == ExtKeyType::kExtPrivkey) {
    version = ExtPrivkey::kVersionTestnetPrivkey;
    if ((net_type == NetType::kMainnet) || (net_type == NetType::kLiquidV1)) {
      version = ExtPrivkey::kVersionMainnetPrivkey;
    }
  } else {
    version = ExtPubkey::kVersionTestnetPubkey;
    if ((net_type == NetType::kMainnet) || (net_type == NetType::kLiquidV1)) {
      version = ExtPubkey::kVersionMainnetPubkey;
    }
  }
  return version;
}